

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::
     format<std::__cxx11::string,std::__cxx11::string,int,std::atomic<int>,long,std::__cxx11::string,std::__cxx11::string>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,int *args_2
               ,atomic<int> *args_3,long *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long *in_RSI;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  FormatListRef in_stack_00000010;
  char *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<std::__cxx11::string,std::__cxx11::string,int,std::atomic<int>,long,std::__cxx11::string,std::__cxx11::string>
            (in_RCX,in_R8,in_R9,(atomic<int> *)&stack0xffffffffffffff40,in_RSI,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  vformat(in_RDI,in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}